

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_listener_create(nng_listener *lp,nng_socket sid,char *addr)

{
  int iVar1;
  uint32_t uVar2;
  nni_listener *pnStack_38;
  nng_listener lid;
  nni_listener *l;
  nni_sock *pnStack_28;
  int rv;
  nni_sock *s;
  char *addr_local;
  nng_listener *lp_local;
  nng_socket sid_local;
  
  s = (nni_sock *)addr;
  addr_local = (char *)lp;
  lp_local._0_4_ = sid.id;
  lp_local._4_4_ = nni_sock_find(&stack0xffffffffffffffd8,sid.id);
  if (lp_local._4_4_ == 0) {
    iVar1 = nni_listener_create(&stack0xffffffffffffffc8,pnStack_28,(char *)s);
    if (iVar1 == 0) {
      uVar2 = nni_listener_id(pnStack_38);
      *(uint32_t *)addr_local = uVar2;
      nni_listener_rele(pnStack_38);
      lp_local._4_4_ = 0;
    }
    else {
      nni_sock_rele(pnStack_28);
      lp_local._4_4_ = iVar1;
    }
  }
  return lp_local._4_4_;
}

Assistant:

int
nng_listener_create(nng_listener *lp, nng_socket sid, const char *addr)
{
	nni_sock     *s;
	int           rv;
	nni_listener *l;
	nng_listener  lid;

	if ((rv = nni_sock_find(&s, sid.id)) != 0) {
		return (rv);
	}
	if ((rv = nni_listener_create(&l, s, addr)) != 0) {
		nni_sock_rele(s);
		return (rv);
	}
	lid.id = nni_listener_id(l);
	*lp    = lid;
	nni_listener_rele(l);
	return (0);
}